

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::to_string<int,double>(string *__return_storage_ptr__,lest *this,pair<int,_double> *pair)

{
  ostream *poVar1;
  int *value;
  double *value_00;
  ostringstream oss;
  string local_1d0;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"{ ");
  string_maker<int>::to_string_abi_cxx11_(&local_1b0,(string_maker<int> *)this,value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1b0);
  poVar1 = std::operator<<(poVar1,", ");
  string_maker<double>::to_string_abi_cxx11_(&local_1d0,(string_maker<double> *)(this + 8),value_00)
  ;
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  std::operator<<(poVar1," }");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( std::pair<T1,T2> const & pair )
{
    std::ostringstream oss;
    oss << "{ " << to_string( pair.first ) << ", " << to_string( pair.second ) << " }";
    return oss.str();
}